

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O1

void __thiscall
BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BTs
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          cmListFileBacktrace *bt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->Value).field_2;
  (this->Value)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (v->_M_dataplus)._M_p;
  paVar2 = &v->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&v->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Value).field_2 + 8) = uVar4;
  }
  else {
    (this->Value)._M_dataplus._M_p = pcVar3;
    (this->Value).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Value)._M_string_length = v->_M_string_length;
  (v->_M_dataplus)._M_p = (pointer)paVar2;
  v->_M_string_length = 0;
  (v->field_2)._M_local_buf[0] = '\0';
  (this->Backtraces).super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Backtraces).super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Backtraces).super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::
  emplace_back<cmListFileBacktrace>(&this->Backtraces,bt);
  return;
}

Assistant:

BTs(T v = T(), cmListFileBacktrace bt = cmListFileBacktrace())
    : Value(std::move(v))
  {
    this->Backtraces.emplace_back(std::move(bt));
  }